

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O1

void __thiscall
pstore::
error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
::~error_or(error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            *this)

{
  anon_struct_8_0_00000001_for___align aVar1;
  tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *ptVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  
  if (this->has_error_ != false) {
    error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<std::__cxx11::string,void>>>
    ::
    error_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<std::__cxx11::string,void>>>&,std::error_code>
              (this);
    return;
  }
  ptVar2 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<std::__cxx11::string,void>>>
           ::
           value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<std::__cxx11::string,void>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<std::__cxx11::string,void>>>
                     (this);
  if ((ptVar2->
      super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
      ).
      super__Tuple_impl<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
      .
      super__Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
      ._M_head_impl.valid_ == true) {
    (ptVar2->
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
    ).
    super__Tuple_impl<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
    .
    super__Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
    ._M_head_impl.valid_ = false;
    aVar1 = (ptVar2->
            super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
            ).
            super__Tuple_impl<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
            .
            super__Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
            ._M_head_impl.storage_.__align;
    aVar3 = (anon_struct_8_0_00000001_for___align)
            ((long)&(ptVar2->
                    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    ).
                    super__Tuple_impl<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    .
                    super__Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
                    ._M_head_impl.storage_ + 0x10);
    if (aVar1 != aVar3) {
      operator_delete((void *)aVar1,*(long *)aVar3 + 1);
      return;
    }
  }
  return;
}

Assistant:

error_or<T>::~error_or () {
        if (!has_error_) {
            get_storage ()->~storage_type ();
        } else {
            using error_code = std::error_code;
            get_error_storage ()->~error_code ();
        }
    }